

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

uint __thiscall crnlib::etc1_block::get_byte_bits(etc1_block *this,uint ofs,uint num)

{
  uint byte_bit_ofs;
  uint byte_ofs;
  uint num_local;
  uint ofs_local;
  etc1_block *this_local;
  
  return (int)(uint)this->m_low_color[(ulong)(7 - (ofs >> 3)) - 8] >> ((byte)ofs & 7) &
         (1 << ((byte)num & 0x1f)) - 1U;
}

Assistant:

inline uint get_byte_bits(uint ofs, uint num) const
        {
            CRNLIB_ASSERT((ofs + num) <= 64U);
            CRNLIB_ASSERT(num && (num <= 8U));
            CRNLIB_ASSERT((ofs >> 3) == ((ofs + num - 1) >> 3));
            const uint byte_ofs = 7 - (ofs >> 3);
            const uint byte_bit_ofs = ofs & 7;
            return (m_bytes[byte_ofs] >> byte_bit_ofs) & ((1 << num) - 1);
        }